

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UDateTimePatternConflict __thiscall
icu_63::DateTimePatternGenerator::addPatternWithSkeleton
          (DateTimePatternGenerator *this,UnicodeString *pattern,UnicodeString *skeletonToUse,
          UBool override,UnicodeString *conflictingPattern,UErrorCode *status)

{
  UnicodeString *pUVar1;
  UDateTimePatternConflict UVar2;
  UBool entryHadSpecifiedSkeleton;
  PtnSkeleton *entrySpecifiedSkeleton;
  UnicodeString basePattern;
  PtnSkeleton skeleton;
  DateTimeMatcher matcher;
  char local_1a9;
  UnicodeString *local_1a8;
  PtnSkeleton *local_1a0;
  UnicodeString local_198;
  PtnSkeleton local_158;
  DateTimeMatcher local_c8;
  
  if (U_ZERO_ERROR < this->internalErrorCode) {
    *status = this->internalErrorCode;
    return UDATPG_NO_CONFLICT;
  }
  local_198.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_198.fUnion.fStackFields.fLengthAndFlags = 2;
  local_158._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
  local_158.original.chars[0] = '\0';
  local_158.original.chars[1] = '\0';
  local_158.original.chars[2] = '\0';
  local_158.original.chars[3] = '\0';
  local_158.original.chars[4] = '\0';
  local_158.original.chars[5] = '\0';
  local_158.original.chars[6] = '\0';
  local_158.original.chars[7] = '\0';
  local_158.original.chars[8] = '\0';
  local_158.original.chars[9] = '\0';
  local_158.original.chars[10] = '\0';
  local_158.original.chars[0xb] = '\0';
  local_158.original.chars[0xc] = '\0';
  local_158.original.chars[0xd] = '\0';
  local_158.original.chars[0xe] = '\0';
  local_158.original.chars[0xf] = '\0';
  local_158.original.lengths[0] = '\0';
  local_158.original.lengths[1] = '\0';
  local_158.original.lengths[2] = '\0';
  local_158.original.lengths[3] = '\0';
  local_158.original.lengths[4] = '\0';
  local_158.original.lengths[5] = '\0';
  local_158.original.lengths[6] = '\0';
  local_158.original.lengths[7] = '\0';
  local_158.original.lengths[8] = '\0';
  local_158.original.lengths[9] = '\0';
  local_158.original.lengths[10] = '\0';
  local_158.original.lengths[0xb] = '\0';
  local_158.original.lengths[0xc] = '\0';
  local_158.original.lengths[0xd] = '\0';
  local_158.original.lengths[0xe] = '\0';
  local_158.original.lengths[0xf] = '\0';
  local_158.baseOriginal.chars[0] = '\0';
  local_158.baseOriginal.chars[1] = '\0';
  local_158.baseOriginal.chars[2] = '\0';
  local_158.baseOriginal.chars[3] = '\0';
  local_158.baseOriginal.chars[4] = '\0';
  local_158.baseOriginal.chars[5] = '\0';
  local_158.baseOriginal.chars[6] = '\0';
  local_158.baseOriginal.chars[7] = '\0';
  local_158.baseOriginal.chars[8] = '\0';
  local_158.baseOriginal.chars[9] = '\0';
  local_158.baseOriginal.chars[10] = '\0';
  local_158.baseOriginal.chars[0xb] = '\0';
  local_158.baseOriginal.chars[0xc] = '\0';
  local_158.baseOriginal.chars[0xd] = '\0';
  local_158.baseOriginal.chars[0xe] = '\0';
  local_158.baseOriginal.chars[0xf] = '\0';
  local_158.baseOriginal.lengths[0] = '\0';
  local_158.baseOriginal.lengths[1] = '\0';
  local_158.baseOriginal.lengths[2] = '\0';
  local_158.baseOriginal.lengths[3] = '\0';
  local_158.baseOriginal.lengths[4] = '\0';
  local_158.baseOriginal.lengths[5] = '\0';
  local_158.baseOriginal.lengths[6] = '\0';
  local_158.baseOriginal.lengths[7] = '\0';
  local_158.baseOriginal.lengths[8] = '\0';
  local_158.baseOriginal.lengths[9] = '\0';
  local_158.baseOriginal.lengths[10] = '\0';
  local_158.baseOriginal.lengths[0xb] = '\0';
  local_158.baseOriginal.lengths[0xc] = '\0';
  local_158.baseOriginal.lengths[0xd] = '\0';
  local_158.baseOriginal.lengths[0xe] = '\0';
  local_158.baseOriginal.lengths[0xf] = '\0';
  local_c8._vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_0047d800;
  local_c8.skeleton._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
  local_c8.skeleton.original.chars[0] = '\0';
  local_c8.skeleton.original.chars[1] = '\0';
  local_c8.skeleton.original.chars[2] = '\0';
  local_c8.skeleton.original.chars[3] = '\0';
  local_c8.skeleton.original.chars[4] = '\0';
  local_c8.skeleton.original.chars[5] = '\0';
  local_c8.skeleton.original.chars[6] = '\0';
  local_c8.skeleton.original.chars[7] = '\0';
  local_c8.skeleton.original.chars[8] = '\0';
  local_c8.skeleton.original.chars[9] = '\0';
  local_c8.skeleton.original.chars[10] = '\0';
  local_c8.skeleton.original.chars[0xb] = '\0';
  local_c8.skeleton.original.chars[0xc] = '\0';
  local_c8.skeleton.original.chars[0xd] = '\0';
  local_c8.skeleton.original.chars[0xe] = '\0';
  local_c8.skeleton.original.chars[0xf] = '\0';
  local_c8.skeleton.original.lengths[0] = '\0';
  local_c8.skeleton.original.lengths[1] = '\0';
  local_c8.skeleton.original.lengths[2] = '\0';
  local_c8.skeleton.original.lengths[3] = '\0';
  local_c8.skeleton.original.lengths[4] = '\0';
  local_c8.skeleton.original.lengths[5] = '\0';
  local_c8.skeleton.original.lengths[6] = '\0';
  local_c8.skeleton.original.lengths[7] = '\0';
  local_c8.skeleton.original.lengths[8] = '\0';
  local_c8.skeleton.original.lengths[9] = '\0';
  local_c8.skeleton.original.lengths[10] = '\0';
  local_c8.skeleton.original.lengths[0xb] = '\0';
  local_c8.skeleton.original.lengths[0xc] = '\0';
  local_c8.skeleton.original.lengths[0xd] = '\0';
  local_c8.skeleton.original.lengths[0xe] = '\0';
  local_c8.skeleton.original.lengths[0xf] = '\0';
  local_c8.skeleton.baseOriginal.chars[0] = '\0';
  local_c8.skeleton.baseOriginal.chars[1] = '\0';
  local_c8.skeleton.baseOriginal.chars[2] = '\0';
  local_c8.skeleton.baseOriginal.chars[3] = '\0';
  local_c8.skeleton.baseOriginal.chars[4] = '\0';
  local_c8.skeleton.baseOriginal.chars[5] = '\0';
  local_c8.skeleton.baseOriginal.chars[6] = '\0';
  local_c8.skeleton.baseOriginal.chars[7] = '\0';
  local_c8.skeleton.baseOriginal.chars[8] = '\0';
  local_c8.skeleton.baseOriginal.chars[9] = '\0';
  local_c8.skeleton.baseOriginal.chars[10] = '\0';
  local_c8.skeleton.baseOriginal.chars[0xb] = '\0';
  local_c8.skeleton.baseOriginal.chars[0xc] = '\0';
  local_c8.skeleton.baseOriginal.chars[0xd] = '\0';
  local_c8.skeleton.baseOriginal.chars[0xe] = '\0';
  local_c8.skeleton.baseOriginal.chars[0xf] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0] = '\0';
  local_c8.skeleton.baseOriginal.lengths[1] = '\0';
  local_c8.skeleton.baseOriginal.lengths[2] = '\0';
  local_c8.skeleton.baseOriginal.lengths[3] = '\0';
  local_c8.skeleton.baseOriginal.lengths[4] = '\0';
  local_c8.skeleton.baseOriginal.lengths[5] = '\0';
  local_c8.skeleton.baseOriginal.lengths[6] = '\0';
  local_c8.skeleton.baseOriginal.lengths[7] = '\0';
  local_c8.skeleton.baseOriginal.lengths[8] = '\0';
  local_c8.skeleton.baseOriginal.lengths[9] = '\0';
  local_c8.skeleton.baseOriginal.lengths[10] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0xb] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0xc] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0xd] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0xe] = '\0';
  local_c8.skeleton.baseOriginal.lengths[0xf] = '\0';
  pUVar1 = skeletonToUse;
  if (skeletonToUse == (UnicodeString *)0x0) {
    pUVar1 = pattern;
  }
  local_1a8 = pattern;
  DateTimeMatcher::set(&local_c8,pUVar1,this->fp,&local_158);
  DateTimeMatcher::getBasePattern(&local_c8,&local_198);
  pUVar1 = PatternMap::getPatternFromBasePattern(this->patternMap,&local_198,&local_1a9);
  UVar2 = UDATPG_NO_CONFLICT;
  if ((pUVar1 != (UnicodeString *)0x0) &&
     ((skeletonToUse != (UnicodeString *)0x0 && override == '\0' ||
      (UVar2 = UDATPG_NO_CONFLICT, local_1a9 == '\0')))) {
    icu_63::UnicodeString::operator=(conflictingPattern,pUVar1);
    UVar2 = UDATPG_BASE_CONFLICT;
    if (override == '\0') goto LAB_002ec54a;
  }
  local_1a0 = (PtnSkeleton *)0x0;
  pUVar1 = PatternMap::getPatternFromSkeleton(this->patternMap,&local_158,&local_1a0);
  if (pUVar1 != (UnicodeString *)0x0) {
    icu_63::UnicodeString::operator=(conflictingPattern,pUVar1);
    UVar2 = UDATPG_CONFLICT;
    if ((override == '\0') ||
       ((skeletonToUse != (UnicodeString *)0x0 && (local_1a0 != (PtnSkeleton *)0x0))))
    goto LAB_002ec54a;
  }
  PatternMap::add(this->patternMap,&local_198,&local_158,local_1a8,
                  skeletonToUse != (UnicodeString *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar2 = UDATPG_NO_CONFLICT;
  }
LAB_002ec54a:
  icu_63::UnicodeString::~UnicodeString(&local_198);
  return UVar2;
}

Assistant:

UDateTimePatternConflict
DateTimePatternGenerator::addPatternWithSkeleton(
    const UnicodeString& pattern,
    const UnicodeString* skeletonToUse,
    UBool override,
    UnicodeString& conflictingPattern,
    UErrorCode& status)
{
    if (U_FAILURE(internalErrorCode)) {
        status = internalErrorCode;
        return UDATPG_NO_CONFLICT;
    }

    UnicodeString basePattern;
    PtnSkeleton   skeleton;
    UDateTimePatternConflict conflictingStatus = UDATPG_NO_CONFLICT;

    DateTimeMatcher matcher;
    if ( skeletonToUse == nullptr ) {
        matcher.set(pattern, fp, skeleton);
        matcher.getBasePattern(basePattern);
    } else {
        matcher.set(*skeletonToUse, fp, skeleton); // no longer trims skeleton fields to max len 3, per #7930
        matcher.getBasePattern(basePattern); // or perhaps instead: basePattern = *skeletonToUse;
    }
    // We only care about base conflicts - and replacing the pattern associated with a base - if:
    // 1. the conflicting previous base pattern did *not* have an explicit skeleton; in that case the previous
    // base + pattern combination was derived from either (a) a canonical item, (b) a standard format, or
    // (c) a pattern specified programmatically with a previous call to addPattern (which would only happen
    // if we are getting here from a subsequent call to addPattern).
    // 2. a skeleton is specified for the current pattern, but override=false; in that case we are checking
    // availableFormats items from root, which should not override any previous entry with the same base.
    UBool entryHadSpecifiedSkeleton;
    const UnicodeString *duplicatePattern = patternMap->getPatternFromBasePattern(basePattern, entryHadSpecifiedSkeleton);
    if (duplicatePattern != nullptr && (!entryHadSpecifiedSkeleton || (skeletonToUse != nullptr && !override))) {
        conflictingStatus = UDATPG_BASE_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override) {
            return conflictingStatus;
        }
    }
    // The only time we get here with override=true and skeletonToUse!=null is when adding availableFormats
    // items from CLDR data. In that case, we don't want an item from a parent locale to replace an item with
    // same skeleton from the specified locale, so skip the current item if skeletonWasSpecified is true for
    // the previously-specified conflicting item.
    const PtnSkeleton* entrySpecifiedSkeleton = nullptr;
    duplicatePattern = patternMap->getPatternFromSkeleton(skeleton, &entrySpecifiedSkeleton);
    if (duplicatePattern != nullptr ) {
        conflictingStatus = UDATPG_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override || (skeletonToUse != nullptr && entrySpecifiedSkeleton != nullptr)) {
            return conflictingStatus;
        }
    }
    patternMap->add(basePattern, skeleton, pattern, skeletonToUse != nullptr, status);
    if(U_FAILURE(status)) {
        return conflictingStatus;
    }

    return UDATPG_NO_CONFLICT;
}